

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmCommonTargetGenerator::AddModuleDefinitionFlag
          (cmCommonTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmLocalCommonGenerator *pcVar2;
  ModuleDefinitionInfo *pMVar3;
  char *__s;
  size_t sVar4;
  string flag;
  string local_90;
  string local_70;
  string local_50;
  
  pMVar3 = cmGeneratorTarget::GetModuleDefinitionInfo(this->GeneratorTarget,&this->ConfigName);
  if ((pMVar3 != (ModuleDefinitionInfo *)0x0) && ((pMVar3->DefFile)._M_string_length != 0)) {
    this_00 = this->Makefile;
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"CMAKE_LINK_DEF_FILE_FLAG","");
    __s = cmMakefile::GetDefinition(this_00,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (__s != (char *)0x0) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar4);
      pcVar2 = this->LocalCommonGenerator;
      (*linkLineComputer->_vptr_cmLinkLineComputer[2])(&local_50,linkLineComputer,pMVar3);
      cmOutputConverter::ConvertToOutputFormat
                (&local_70,&(pcVar2->super_cmLocalGenerator).super_cmOutputConverter,&local_50,SHELL
                );
      std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      (*(this->LocalCommonGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this->LocalCommonGenerator,flags,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddModuleDefinitionFlag(
  cmLinkLineComputer* linkLineComputer, std::string& flags)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || mdi->DefFile.empty()) {
    return;
  }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if (!defFileFlag) {
    return;
  }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += this->LocalCommonGenerator->ConvertToOutputFormat(
    linkLineComputer->ConvertToLinkReference(mdi->DefFile),
    cmOutputConverter::SHELL);
  this->LocalCommonGenerator->AppendFlags(flags, flag);
}